

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O3

Mat * __thiscall
ncnn::ModelBinFromDataReader::load
          (Mat *__return_storage_ptr__,ModelBinFromDataReader *this,int w,int type)

{
  long lVar1;
  DataReader *pDVar2;
  pointer puVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  ulong uVar5;
  int *piVar6;
  size_t sVar7;
  ulong uVar8;
  unsigned_short *puVar9;
  ulong __new_size;
  size_t __n;
  vector<unsigned_short,_std::allocator<unsigned_short>_> float16_weights;
  anon_union_4_2_77b30072 flag_struct;
  void *refbuf;
  vector<signed_char,_std::allocator<signed_char>_> int8_weights;
  Mat local_4a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_458;
  uint local_434;
  unsigned_short *local_430;
  Mat local_428 [14];
  
  local_4a8.cstep = 0;
  local_4a8.data = (unsigned_short *)0x0;
  local_4a8.refcount._0_4_ = 0;
  local_4a8.refcount._4_4_ = 0;
  local_4a8.elemsize._0_4_ = 0;
  local_4a8.elemsize._4_4_ = 0;
  local_4a8.elempack = 0;
  local_4a8.allocator = (Allocator *)0x0;
  local_4a8.dims = 0;
  local_4a8.w = 0;
  local_4a8.h = 0;
  local_4a8.d = 0;
  local_4a8.c = 0;
  if (type != 1) {
    if (type != 0) {
      load();
      goto LAB_00131fc7;
    }
    pDVar2 = this->d->dr;
    iVar4 = (*pDVar2->_vptr_DataReader[3])(pDVar2,&local_434,4);
    if (CONCAT44(extraout_var,iVar4) != 4) {
      load();
      goto LAB_00131fc7;
    }
    if (local_434 == 0x2c056) {
      local_428[0].data = (unsigned_short *)0x0;
      pDVar2 = this->d->dr;
      lVar1 = (long)w * 4;
      iVar4 = (*pDVar2->_vptr_DataReader[4])(pDVar2,lVar1);
      puVar9 = (unsigned_short *)local_428[0].data;
      if (CONCAT44(extraout_var_04,iVar4) != lVar1) {
        Mat::create(&local_4a8,w,4,(Allocator *)0x0);
        if (((unsigned_short *)local_4a8.data != (unsigned_short *)0x0) &&
           (local_4a8.cstep * (long)local_4a8.c != 0)) {
          pDVar2 = this->d->dr;
          iVar4 = (*pDVar2->_vptr_DataReader[3])(pDVar2,local_4a8.data,lVar1);
          if (CONCAT44(extraout_var_08,iVar4) != lVar1) {
            load();
            goto LAB_00131fc7;
          }
          goto LAB_00131935;
        }
        goto LAB_00131ee9;
      }
      piVar6 = (int *)CONCAT44(local_4a8.refcount._4_4_,local_4a8.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_4a8.allocator == (Allocator *)0x0) goto LAB_00131d7d;
          (*(local_4a8.allocator)->_vptr_Allocator[3])();
        }
      }
      goto LAB_00131d8a;
    }
    if (local_434 == 0xd4b38) {
      __n = (size_t)w;
      uVar8 = __n + 3 & 0xfffffffffffffffc;
      local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pDVar2 = this->d->dr;
      iVar4 = (*pDVar2->_vptr_DataReader[4])(pDVar2,uVar8);
      puVar3 = local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (CONCAT44(extraout_var_03,iVar4) != uVar8) {
        local_428[0].data = (unsigned_short *)0x0;
        local_428[0].refcount = (int *)0x0;
        local_428[0].elemsize = 0;
        std::vector<signed_char,_std::allocator<signed_char>_>::resize
                  ((vector<signed_char,_std::allocator<signed_char>_> *)local_428,uVar8);
        pDVar2 = this->d->dr;
        iVar4 = (*pDVar2->_vptr_DataReader[3])(pDVar2,local_428[0].data,uVar8);
        if (CONCAT44(extraout_var_07,iVar4) == uVar8) {
          Mat::create(&local_4a8,w,1,(Allocator *)0x0);
          if (((unsigned_short *)local_4a8.data != (unsigned_short *)0x0) &&
             (local_4a8.cstep * (long)local_4a8.c != 0)) {
            memcpy(local_4a8.data,local_428[0].data,__n);
            if ((unsigned_short *)local_428[0].data != (unsigned_short *)0x0) {
              operator_delete(local_428[0].data,local_428[0].elemsize - (long)local_428[0].data);
            }
            piVar6 = (int *)CONCAT44(local_4a8.refcount._4_4_,local_4a8.refcount._0_4_);
            sVar7 = CONCAT44(local_4a8.elemsize._4_4_,(undefined4)local_4a8.elemsize);
            goto LAB_00131fa2;
          }
          __return_storage_ptr__->data = local_4a8.data;
          piVar6 = (int *)CONCAT44(local_4a8.refcount._4_4_,local_4a8.refcount._0_4_);
          __return_storage_ptr__->refcount = piVar6;
          __return_storage_ptr__->elemsize =
               CONCAT44(local_4a8.elemsize._4_4_,(undefined4)local_4a8.elemsize);
          __return_storage_ptr__->elempack = local_4a8.elempack;
          __return_storage_ptr__->allocator = local_4a8.allocator;
          __return_storage_ptr__->dims = local_4a8.dims;
          __return_storage_ptr__->w = local_4a8.w;
          __return_storage_ptr__->h = local_4a8.h;
          __return_storage_ptr__->d = local_4a8.d;
          __return_storage_ptr__->c = local_4a8.c;
          __return_storage_ptr__->cstep = local_4a8.cstep;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
        }
        else {
          load();
        }
        if ((unsigned_short *)local_428[0].data != (unsigned_short *)0x0) {
          operator_delete(local_428[0].data,local_428[0].elemsize - (long)local_428[0].data);
        }
        goto LAB_00131fc7;
      }
      piVar6 = (int *)CONCAT44(local_4a8.refcount._4_4_,local_4a8.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_4a8.allocator == (Allocator *)0x0) {
            if ((unsigned_short *)local_4a8.data != (unsigned_short *)0x0) {
              free(local_4a8.data);
            }
          }
          else {
            (*(local_4a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_4a8.data = puVar3;
      local_4a8.refcount._0_4_ = 0;
      local_4a8.refcount._4_4_ = 0;
      local_4a8.elemsize._0_4_ = 1;
      local_4a8.elemsize._4_4_ = 0;
      local_4a8.elempack = 1;
      local_4a8.allocator = (Allocator *)0x0;
      local_4a8.dims = 1;
      local_4a8.h = 1;
      local_4a8.d = 1;
      local_4a8.c = 1;
      sVar7 = 1;
      piVar6 = (int *)0x0;
      local_4a8.w = w;
      local_4a8.cstep = __n;
LAB_00131fa2:
      __return_storage_ptr__->data = local_4a8.data;
      __return_storage_ptr__->refcount = piVar6;
      __return_storage_ptr__->elemsize = sVar7;
      __return_storage_ptr__->elempack = local_4a8.elempack;
      __return_storage_ptr__->allocator = local_4a8.allocator;
      __return_storage_ptr__->dims = local_4a8.dims;
      __return_storage_ptr__->w = local_4a8.w;
      __return_storage_ptr__->h = local_4a8.h;
      __return_storage_ptr__->d = local_4a8.d;
      __return_storage_ptr__->c = local_4a8.c;
      __return_storage_ptr__->cstep = local_4a8.cstep;
      goto LAB_00131fbf;
    }
    if (local_434 == 0x1306b47) {
      __new_size = (long)w * 2 + 3U & 0xfffffffffffffffc;
      local_430 = (unsigned_short *)0x0;
      pDVar2 = this->d->dr;
      iVar4 = (*pDVar2->_vptr_DataReader[4])(pDVar2,__new_size);
      if (CONCAT44(extraout_var_00,iVar4) != __new_size) {
        local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_458,__new_size)
        ;
        pDVar2 = this->d->dr;
        iVar4 = (*pDVar2->_vptr_DataReader[3])
                          (pDVar2,local_458.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,__new_size);
        uVar8 = CONCAT44(extraout_var_09,iVar4);
        if (uVar8 == __new_size) {
          Mat::from_float16(local_428,
                            (unsigned_short *)
                            local_458.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,w);
          if (local_428[0].refcount != (int *)0x0) {
            LOCK();
            *local_428[0].refcount = *local_428[0].refcount + 1;
            UNLOCK();
          }
          piVar6 = (int *)CONCAT44(local_4a8.refcount._4_4_,local_4a8.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_4a8.allocator == (Allocator *)0x0) {
                if ((unsigned_short *)local_4a8.data != (unsigned_short *)0x0) {
                  free(local_4a8.data);
                }
              }
              else {
                (*(local_4a8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_4a8.data = local_428[0].data;
          local_4a8.refcount._0_4_ = SUB84(local_428[0].refcount,0);
          local_4a8.refcount._4_4_ = (undefined4)((ulong)local_428[0].refcount >> 0x20);
          local_4a8.elemsize._0_4_ = (undefined4)local_428[0].elemsize;
          local_4a8.elemsize._4_4_ = (undefined4)(local_428[0].elemsize >> 0x20);
          local_4a8.elempack = local_428[0].elempack;
          local_4a8.allocator = local_428[0].allocator;
          local_4a8.dims = (int)local_428[0]._40_8_;
          local_4a8.w = SUB84(local_428[0]._40_8_,4);
          local_4a8.h = (int)local_428[0]._48_8_;
          local_4a8.d = SUB84(local_428[0]._48_8_,4);
          local_4a8.c = local_428[0].c;
          local_4a8.cstep = local_428[0].cstep;
          if (local_428[0].refcount != (int *)0x0) {
            LOCK();
            *local_428[0].refcount = *local_428[0].refcount + -1;
            UNLOCK();
            if (*local_428[0].refcount == 0) {
              if (local_428[0].allocator == (Allocator *)0x0) {
                if ((unsigned_short *)local_428[0].data != (unsigned_short *)0x0) {
                  free(local_428[0].data);
                }
              }
              else {
                (*(local_428[0].allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        else {
          load();
        }
        goto LAB_001321f7;
      }
      Mat::from_float16(local_428,local_430,w);
      if (local_428[0].refcount != (int *)0x0) {
        LOCK();
        *local_428[0].refcount = *local_428[0].refcount + 1;
        UNLOCK();
      }
      piVar6 = (int *)CONCAT44(local_4a8.refcount._4_4_,local_4a8.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_4a8.allocator == (Allocator *)0x0) {
            if ((unsigned_short *)local_4a8.data != (unsigned_short *)0x0) {
              free(local_4a8.data);
            }
          }
          else {
            (*(local_4a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_4a8.data = local_428[0].data;
      local_4a8.refcount._0_4_ = SUB84(local_428[0].refcount,0);
      local_4a8.refcount._4_4_ = (undefined4)((ulong)local_428[0].refcount >> 0x20);
      local_4a8.elemsize._0_4_ = (undefined4)local_428[0].elemsize;
      local_4a8.elemsize._4_4_ = (undefined4)(local_428[0].elemsize >> 0x20);
      local_4a8.elempack = local_428[0].elempack;
      local_4a8.allocator = local_428[0].allocator;
      local_4a8.dims = (int)local_428[0]._40_8_;
      local_4a8.w = SUB84(local_428[0]._40_8_,4);
      local_4a8.h = (int)local_428[0]._48_8_;
      local_4a8.d = SUB84(local_428[0]._48_8_,4);
      local_4a8.c = local_428[0].c;
      local_4a8.cstep = local_428[0].cstep;
      if (local_428[0].refcount != (int *)0x0) {
        LOCK();
        *local_428[0].refcount = *local_428[0].refcount + -1;
        UNLOCK();
        if (*local_428[0].refcount == 0) {
          if (local_428[0].allocator == (Allocator *)0x0) {
            if ((unsigned_short *)local_428[0].data != (unsigned_short *)0x0) {
              free(local_428[0].data);
            }
          }
          else {
            (*(local_428[0].allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else if ((local_434 >> 0x10 & 0xff) + (local_434 >> 8 & 0xff) + (local_434 & 0xff) == 0 &&
             local_434 >> 0x18 == 0) {
      if ((char)local_434 == '\0') {
        local_428[0].data = (unsigned_short *)0x0;
        pDVar2 = this->d->dr;
        lVar1 = (long)w * 4;
        iVar4 = (*pDVar2->_vptr_DataReader[4])(pDVar2,lVar1);
        if (CONCAT44(extraout_var_10,iVar4) == lVar1) {
          puVar9 = (unsigned_short *)local_428[0].data;
          piVar6 = (int *)CONCAT44(local_4a8.refcount._4_4_,local_4a8.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_4a8.allocator == (Allocator *)0x0) {
                if ((unsigned_short *)local_4a8.data != (unsigned_short *)0x0) {
                  free(local_4a8.data);
                }
              }
              else {
                (*(local_4a8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_4a8.refcount._0_4_ = 0;
          local_4a8.refcount._4_4_ = 0;
          local_4a8.elemsize._0_4_ = 4;
          local_4a8.elemsize._4_4_ = 0;
          local_4a8.elempack = 1;
          local_4a8.allocator = (Allocator *)0x0;
          local_4a8.dims = 1;
          local_4a8.h = 1;
          local_4a8.d = 1;
          local_4a8.c = 1;
          local_4a8.data = puVar9;
          local_4a8.w = w;
          local_4a8.cstep = (long)w;
        }
        else {
          Mat::create(&local_4a8,w,4,(Allocator *)0x0);
          if (((unsigned_short *)local_4a8.data == (unsigned_short *)0x0) ||
             (local_4a8.cstep * (long)local_4a8.c == 0)) goto LAB_00131ee9;
          pDVar2 = this->d->dr;
          iVar4 = (*pDVar2->_vptr_DataReader[3])(pDVar2,local_4a8.data,lVar1);
          if (CONCAT44(extraout_var_11,iVar4) != lVar1) {
            load();
            goto LAB_00131fc7;
          }
        }
      }
    }
    else {
      Mat::create(&local_4a8,w,4,(Allocator *)0x0);
      if (((unsigned_short *)local_4a8.data == (unsigned_short *)0x0) ||
         (local_4a8.cstep * (long)local_4a8.c == 0)) {
        __return_storage_ptr__->data = local_4a8.data;
        goto LAB_00131eec;
      }
      pDVar2 = this->d->dr;
      iVar4 = (*pDVar2->_vptr_DataReader[3])(pDVar2,local_428,0x400);
      if (CONCAT44(extraout_var_05,iVar4) != 0x400) {
        load();
        goto LAB_00131fc7;
      }
      __new_size = (long)w + 3U & 0xfffffffffffffffc;
      local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_458,__new_size);
      pDVar2 = this->d->dr;
      iVar4 = (*pDVar2->_vptr_DataReader[3])
                        (pDVar2,local_458.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,__new_size);
      uVar8 = CONCAT44(extraout_var_06,iVar4);
      if (uVar8 == __new_size) {
        if (w < 1) goto LAB_001321f7;
        uVar5 = 0;
        do {
          *(undefined4 *)((long)local_4a8.data + uVar5 * 2 * 2) =
               *(undefined4 *)
                ((long)&local_428[0].data +
                (ulong)*(byte *)((long)local_458.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar5) * 4);
          uVar5 = uVar5 + 1;
        } while ((uint)w != uVar5);
LAB_001321fc:
        operator_delete(local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_458.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_458.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      else {
        fprintf(_stderr,"ModelBin read index_array failed %zd",uVar8);
        fputc(10,_stderr);
        __return_storage_ptr__->cstep = 0;
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->refcount = (int *)0x0;
        *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->dims = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->h = 0;
        __return_storage_ptr__->d = 0;
        __return_storage_ptr__->c = 0;
LAB_001321f7:
        if ((unsigned_short *)
            local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (unsigned_short *)0x0) goto LAB_001321fc;
      }
      if (uVar8 != __new_size) goto LAB_00131fc7;
    }
    __return_storage_ptr__->data = local_4a8.data;
    piVar6 = (int *)CONCAT44(local_4a8.refcount._4_4_,local_4a8.refcount._0_4_);
    __return_storage_ptr__->refcount = piVar6;
    __return_storage_ptr__->elemsize =
         CONCAT44(local_4a8.elemsize._4_4_,(undefined4)local_4a8.elemsize);
    __return_storage_ptr__->elempack = local_4a8.elempack;
    __return_storage_ptr__->allocator = local_4a8.allocator;
    __return_storage_ptr__->dims = local_4a8.dims;
    __return_storage_ptr__->w = local_4a8.w;
    __return_storage_ptr__->h = local_4a8.h;
    __return_storage_ptr__->d = local_4a8.d;
    __return_storage_ptr__->c = local_4a8.c;
    __return_storage_ptr__->cstep = local_4a8.cstep;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    goto LAB_00131fc7;
  }
  local_428[0].data = (unsigned_short *)0x0;
  pDVar2 = this->d->dr;
  lVar1 = (long)w * 4;
  iVar4 = (*pDVar2->_vptr_DataReader[4])(pDVar2,lVar1);
  puVar9 = (unsigned_short *)local_428[0].data;
  if (CONCAT44(extraout_var_01,iVar4) == lVar1) {
    piVar6 = (int *)CONCAT44(local_4a8.refcount._4_4_,local_4a8.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_4a8.allocator == (Allocator *)0x0) {
LAB_00131d7d:
          puVar9 = (unsigned_short *)local_428[0].data;
          if ((unsigned_short *)local_4a8.data != (unsigned_short *)0x0) {
            free(local_4a8.data);
          }
        }
        else {
          (*(local_4a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
LAB_00131d8a:
    local_4a8.cstep = (size_t)w;
    local_4a8.refcount._0_4_ = 0;
    local_4a8.refcount._4_4_ = 0;
    local_4a8.elemsize._0_4_ = 4;
    local_4a8.elemsize._4_4_ = 0;
    local_4a8.elempack = 1;
    local_4a8.allocator = (Allocator *)0x0;
    local_4a8.dims = 1;
    local_4a8.h = 1;
    local_4a8.d = 1;
    local_4a8.c = 1;
    sVar7 = 4;
    piVar6 = (int *)0x0;
    local_4a8.data = puVar9;
    local_4a8.w = w;
LAB_00131dec:
    __return_storage_ptr__->data = local_4a8.data;
    __return_storage_ptr__->refcount = piVar6;
    __return_storage_ptr__->elemsize = sVar7;
    __return_storage_ptr__->elempack = local_4a8.elempack;
    __return_storage_ptr__->allocator = local_4a8.allocator;
    __return_storage_ptr__->dims = local_4a8.dims;
    __return_storage_ptr__->w = local_4a8.w;
    __return_storage_ptr__->h = local_4a8.h;
    __return_storage_ptr__->d = local_4a8.d;
    __return_storage_ptr__->c = local_4a8.c;
    __return_storage_ptr__->cstep = local_4a8.cstep;
  }
  else {
    Mat::create(&local_4a8,w,4,(Allocator *)0x0);
    if (((unsigned_short *)local_4a8.data != (unsigned_short *)0x0) &&
       (local_4a8.cstep * (long)local_4a8.c != 0)) {
      pDVar2 = this->d->dr;
      iVar4 = (*pDVar2->_vptr_DataReader[3])(pDVar2,local_4a8.data,lVar1);
      if (CONCAT44(extraout_var_02,iVar4) != lVar1) {
        load();
        goto LAB_00131fc7;
      }
LAB_00131935:
      piVar6 = (int *)CONCAT44(local_4a8.refcount._4_4_,local_4a8.refcount._0_4_);
      sVar7 = CONCAT44(local_4a8.elemsize._4_4_,(undefined4)local_4a8.elemsize);
      goto LAB_00131dec;
    }
LAB_00131ee9:
    __return_storage_ptr__->data = local_4a8.data;
LAB_00131eec:
    piVar6 = (int *)CONCAT44(local_4a8.refcount._4_4_,local_4a8.refcount._0_4_);
    __return_storage_ptr__->refcount = piVar6;
    __return_storage_ptr__->elemsize =
         CONCAT44(local_4a8.elemsize._4_4_,(undefined4)local_4a8.elemsize);
    __return_storage_ptr__->elempack = local_4a8.elempack;
    __return_storage_ptr__->allocator = local_4a8.allocator;
    __return_storage_ptr__->dims = local_4a8.dims;
    __return_storage_ptr__->w = local_4a8.w;
    __return_storage_ptr__->h = local_4a8.h;
    __return_storage_ptr__->d = local_4a8.d;
    __return_storage_ptr__->c = local_4a8.c;
    __return_storage_ptr__->cstep = local_4a8.cstep;
  }
LAB_00131fbf:
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + 1;
    UNLOCK();
  }
LAB_00131fc7:
  piVar6 = (int *)CONCAT44(local_4a8.refcount._4_4_,local_4a8.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_4a8.allocator == (Allocator *)0x0) {
        if ((unsigned_short *)local_4a8.data != (unsigned_short *)0x0) {
          free(local_4a8.data);
        }
      }
      else {
        (*(local_4a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBinFromDataReader::load(int w, int type) const
{
    Mat m;

    if (type == 0)
    {
        size_t nread;

        union
        {
            struct
            {
                unsigned char f0;
                unsigned char f1;
                unsigned char f2;
                unsigned char f3;
            };
            unsigned int tag;
        } flag_struct;

        nread = d->dr.read(&flag_struct, sizeof(flag_struct));
        if (nread != sizeof(flag_struct))
        {
            NCNN_LOGE("ModelBin read flag_struct failed %zd", nread);
            return Mat();
        }

#if __BIG_ENDIAN__
        swap_endianness_32(&flag_struct.tag);
#endif

        unsigned int flag = (int)flag_struct.f0 + flag_struct.f1 + flag_struct.f2 + flag_struct.f3;

        if (flag_struct.tag == 0x01306B47)
        {
            // half-precision data
            size_t align_data_size = alignSize(w * sizeof(unsigned short), 4);

#if !__BIG_ENDIAN__
            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(align_data_size, &refbuf);
            if (nread == align_data_size)
            {
                m = Mat::from_float16((const unsigned short*)refbuf, w);
            }
            else
#endif
            {
                std::vector<unsigned short> float16_weights;
                float16_weights.resize(align_data_size);
                nread = d->dr.read(&float16_weights[0], align_data_size);
                if (nread != align_data_size)
                {
                    NCNN_LOGE("ModelBin read float16_weights failed %zd", nread);
                    return Mat();
                }

#if __BIG_ENDIAN__
                for (int i = 0; i < w; i++)
                {
                    swap_endianness_16(&float16_weights[i]);
                }
#endif

                m = Mat::from_float16(&float16_weights[0], w);
            }

            return m;
        }
        else if (flag_struct.tag == 0x000D4B38)
        {
            // int8 data
            size_t align_data_size = alignSize(w, 4);

#if !__BIG_ENDIAN__
            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(align_data_size, &refbuf);
            if (nread == align_data_size)
            {
                m = Mat(w, (void*)refbuf, (size_t)1u);
            }
            else
#endif
            {
                std::vector<signed char> int8_weights;
                int8_weights.resize(align_data_size);
                nread = d->dr.read(&int8_weights[0], align_data_size);
                if (nread != align_data_size)
                {
                    NCNN_LOGE("ModelBin read int8_weights failed %zd", nread);
                    return Mat();
                }

                m.create(w, (size_t)1u);
                if (m.empty())
                    return m;

                memcpy(m.data, &int8_weights[0], w);
            }

            return m;
        }
        else if (flag_struct.tag == 0x0002C056)
        {
#if !__BIG_ENDIAN__
            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(w * sizeof(float), &refbuf);
            if (nread == w * sizeof(float))
            {
                m = Mat(w, (void*)refbuf);
            }
            else
#endif
            {
                m.create(w);
                if (m.empty())
                    return m;

                // raw data with extra scaling
                nread = d->dr.read(m, w * sizeof(float));
                if (nread != w * sizeof(float))
                {
                    NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
                    return Mat();
                }

#if __BIG_ENDIAN__
                for (int i = 0; i < w; i++)
                {
                    swap_endianness_32((float*)m + i);
                }
#endif
            }

            return m;
        }

        if (flag != 0)
        {
            m.create(w);
            if (m.empty())
                return m;

            // quantized data
            float quantization_value[256];
            nread = d->dr.read(quantization_value, 256 * sizeof(float));
            if (nread != 256 * sizeof(float))
            {
                NCNN_LOGE("ModelBin read quantization_value failed %zd", nread);
                return Mat();
            }

#if __BIG_ENDIAN__
            for (int i = 0; i < 256; i++)
            {
                swap_endianness_32(&quantization_value[i]);
            }
#endif

            size_t align_weight_data_size = alignSize(w * sizeof(unsigned char), 4);
            std::vector<unsigned char> index_array;
            index_array.resize(align_weight_data_size);
            nread = d->dr.read(&index_array[0], align_weight_data_size);
            if (nread != align_weight_data_size)
            {
                NCNN_LOGE("ModelBin read index_array failed %zd", nread);
                return Mat();
            }

            float* ptr = m;
            for (int i = 0; i < w; i++)
            {
                ptr[i] = quantization_value[index_array[i]];
            }
        }
        else if (flag_struct.f0 == 0)
        {
#if !__BIG_ENDIAN__
            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(w * sizeof(float), &refbuf);
            if (nread == w * sizeof(float))
            {
                m = Mat(w, (void*)refbuf);
            }
            else
#endif
            {
                m.create(w);
                if (m.empty())
                    return m;

                // raw data
                nread = d->dr.read(m, w * sizeof(float));
                if (nread != w * sizeof(float))
                {
                    NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
                    return Mat();
                }

#if __BIG_ENDIAN__
                for (int i = 0; i < w; i++)
                {
                    swap_endianness_32((float*)m + i);
                }
#endif
            }
        }

        return m;
    }
    else if (type == 1)
    {
#if !__BIG_ENDIAN__
        // try reference data
        const void* refbuf = 0;
        size_t nread = d->dr.reference(w * sizeof(float), &refbuf);
        if (nread == w * sizeof(float))
        {
            m = Mat(w, (void*)refbuf);
        }
        else
#endif
        {
            m.create(w);
            if (m.empty())
                return m;

            // raw data
            size_t nread = d->dr.read(m, w * sizeof(float));
            if (nread != w * sizeof(float))
            {
                NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
                return Mat();
            }

#if __BIG_ENDIAN__
            for (int i = 0; i < w; i++)
            {
                swap_endianness_32((float*)m + i);
            }
#endif
        }

        return m;
    }
    else
    {
        NCNN_LOGE("ModelBin load type %d not implemented", type);
        return Mat();
    }

    return Mat();
}